

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_set_nested(int flag)

{
  kmp_info_t *pkVar1;
  int in_EDI;
  int max_active_levels;
  kmp_info_t *thread;
  int local_48;
  int local_44;
  undefined1 local_20 [8];
  kmp_info_t *local_18;
  int local_4;
  
  local_4 = in_EDI;
  __kmp_msg_format((uint)local_20,0x4010e,"omp_set_nested","omp_set_max_active_levels");
  __kmp_msg(kmp_ms_inform);
  pkVar1 = __kmp_entry_thread();
  __kmp_save_internal_controls(local_18);
  local_44 = (((pkVar1->th).th_current_task)->td_icvs).max_active_levels;
  if (local_44 == 1) {
    local_44 = 0x7fffffff;
  }
  if (local_4 == 0) {
    local_48 = 1;
  }
  else {
    local_48 = local_44;
  }
  (((pkVar1->th).th_current_task)->td_icvs).max_active_levels = local_48;
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_NESTED)(int KMP_DEREF flag) {
  KMP_INFORM(APIDeprecated, "omp_set_nested", "omp_set_max_active_levels");
#ifdef KMP_STUB
  __kmps_set_nested(KMP_DEREF flag);
#else
  kmp_info_t *thread;
  /* For the thread-private internal controls implementation */
  thread = __kmp_entry_thread();
  __kmp_save_internal_controls(thread);
  // Somewhat arbitrarily decide where to get a value for max_active_levels
  int max_active_levels = get__max_active_levels(thread);
  if (max_active_levels == 1)
    max_active_levels = KMP_MAX_ACTIVE_LEVELS_LIMIT;
  set__max_active_levels(thread, (KMP_DEREF flag) ? max_active_levels : 1);
#endif
}